

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::AND(m6502 *this)

{
  m6502 *this_local;
  
  fetch(this);
  this->a = this->a & this->fetched;
  SetFlag(this,Z,this->a == '\0');
  SetFlag(this,N,(this->a & 0x80) != 0);
  return '\x01';
}

Assistant:

uint8_t AND()
  {
    fetch();
    a &= fetched;
    SetFlag(Z, a == 0x00u);
    SetFlag(N, a & 0x80u);
    return 1;
  }